

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void db_compact_overwrite(void)

{
  fdb_encryption_key *__s;
  fdb_status fVar1;
  int iVar2;
  fdb_kvs_config *kvs_config;
  size_t sVar3;
  size_t sVar4;
  fdb_file_info *kvs_config_00;
  void *__s2;
  ulong uVar5;
  fdb_kvs_handle **ptr_handle;
  long lVar6;
  uint uVar7;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar8;
  char *pcVar9;
  fdb_file_info *info;
  fdb_kvs_handle *pfVar10;
  char *ptr_fhandle;
  undefined1 handle [8];
  fdb_kvs_handle *unaff_R12;
  __atomic_base<unsigned_long> unaff_R13;
  __atomic_base<unsigned_long> _Var11;
  filemgr *ptr_fhandle_00;
  fdb_config *pfVar12;
  ulong uVar13;
  fdb_kvs_handle *pfVar14;
  timeval tVar15;
  timeval tVar16;
  fdb_kvs_handle *db2;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile2;
  fdb_file_handle *dbfile;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_15288;
  undefined1 auStack_15280 [16];
  undefined1 auStack_15270 [8];
  undefined1 auStack_15268 [80];
  ulong uStack_15218;
  timeval tStack_151f8;
  fdb_file_info afStack_151e8 [3];
  fdb_file_info afStack_150e8 [3];
  fdb_config fStack_14fe8;
  filemgr *pfStack_14ef0;
  fdb_kvs_handle *pfStack_14ee8;
  fdb_kvs_handle *pfStack_14ee0;
  fdb_config *pfStack_14ed8;
  fdb_kvs_handle *pfStack_14ed0;
  fdb_kvs_handle *pfStack_14ec8;
  fdb_file_handle *pfStack_14eb8;
  fdb_kvs_handle *pfStack_14eb0;
  timeval atStack_14ea8 [2];
  timeval tStack_14e88;
  timeval tStack_14e78;
  undefined1 auStack_14e68 [70];
  undefined1 uStack_14e22;
  undefined8 uStack_14e18;
  filemgr *pfStack_14d58;
  fdb_kvs_handle *pfStack_14d50;
  fdb_kvs_handle *pfStack_14d48;
  filemgr *pfStack_14d40;
  fdb_kvs_handle *pfStack_14d38;
  fdb_kvs_handle *pfStack_14d30;
  undefined1 auStack_14d20 [8];
  undefined1 auStack_14d18 [8];
  undefined1 auStack_14d10 [8];
  undefined1 auStack_14d08 [16];
  undefined1 auStack_14cf8 [16];
  fdb_kvs_config fStack_14ce8;
  atomic<unsigned_long> aStack_14cd0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14cc8;
  __atomic_base<unsigned_long> _Stack_14cc0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14cb8;
  undefined1 auStack_14cb0 [8];
  undefined1 auStack_14ca8 [16];
  undefined1 auStack_14c98 [16];
  atomic<unsigned_long> aStack_14c88;
  fdb_open_flags fStack_14c74;
  ushort uStack_14c6a;
  filemgr *pfStack_14c60;
  atomic<unsigned_long> aStack_14c20;
  undefined1 auStack_14ba0 [16];
  timeval tStack_14b90;
  undefined1 auStack_14b80 [328];
  char acStack_14a38 [256];
  char acStack_14938 [256];
  fdb_kvs_handle afStack_14838 [153];
  fdb_kvs_handle *pfStack_f70;
  fdb_kvs_handle *pfStack_f68;
  list *plStack_f60;
  void *pvStack_f58;
  fdb_kvs_config fStack_f50;
  fdb_kvs_info fStack_f38;
  timeval tStack_f08;
  fdb_config fStack_ef8;
  char acStack_e00 [256];
  fdb_kvs_handle afStack_d00 [2];
  fdb_kvs_handle **ppfStack_7d8;
  fdb_kvs_handle *pfStack_7d0;
  fdb_kvs_handle *pfStack_7c8;
  fdb_kvs_config *pfStack_7c0;
  fdb_kvs_handle *pfStack_7b8;
  fdb_kvs_handle *pfStack_7b0;
  undefined1 local_798 [16];
  undefined1 local_788 [32];
  fdb_kvs_handle *local_768;
  fdb_kvs_config local_760;
  fdb_kvs_info local_748;
  timeval local_718;
  char local_708 [256];
  undefined1 local_608 [752];
  char local_318 [256];
  fdb_kvs_config local_218 [10];
  bool abStack_128 [248];
  
  pfStack_7b0 = (fdb_kvs_handle *)0x10f3b5;
  gettimeofday(&local_718,(__timezone_ptr_t)0x0);
  pfStack_7b0 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_7b0 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_7b0 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config = &local_760;
  pfStack_7b0 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  local_608._256_8_ = 0x1000000;
  local_608._264_8_ = 0x400;
  local_608._284_4_ = 1;
  local_608[0x127] = 0;
  pfVar14 = (fdb_kvs_handle *)(local_788 + 0x18);
  pfStack_7b0 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar14,"./compact_test1",(fdb_config *)(local_608 + 0xf8));
  ptr_handle = (fdb_kvs_handle **)(local_788 + 8);
  pfStack_7b0 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)local_788._24_8_,ptr_handle,(char *)0x0,kvs_config);
  pfStack_7b0 = (fdb_kvs_handle *)0x10f440;
  pfVar10 = (fdb_kvs_handle *)local_788._8_8_;
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)local_788._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar1 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar5 = 0;
    do {
      pfStack_7b0 = (fdb_kvs_handle *)0x10f468;
      sprintf(local_318,"key%d",uVar5 & 0xffffffff);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f480;
      sprintf(local_608 + 0x1f0,"meta%d",uVar5 & 0xffffffff);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f498;
      sprintf(local_708,"body%d",uVar5 & 0xffffffff);
      pfVar14 = (fdb_kvs_handle *)(local_608 + (long)unaff_R12);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f4ab;
      unaff_R13._M_i = strlen(local_318);
      unaff_RBP = (fdb_kvs_handle *)(local_608 + 0x1f0);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f4be;
      kvs_config = (fdb_kvs_config *)strlen((char *)unaff_RBP);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f4ce;
      sVar3 = strlen(local_708);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar14,local_318,unaff_R13._M_i,unaff_RBP,(size_t)kvs_config,
                     local_708,sVar3);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)local_788._8_8_,*(fdb_doc **)(local_608 + uVar5 * 8));
      uVar5 = uVar5 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar5 != 0x1e);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)local_788._24_8_,'\0');
    pfStack_7b0 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(local_788 + 0x10),"./compact_test1.1",
             (fdb_config *)(local_608 + 0xf8));
    ptr_handle = (fdb_kvs_handle **)local_798;
    pfStack_7b0 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)local_788._16_8_,ptr_handle,(char *)0x0,&local_760);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f56b;
    pfVar10 = (fdb_kvs_handle *)local_798._0_8_;
    fVar1 = fdb_set_log_callback
                      ((fdb_kvs_handle *)local_798._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar5 = 0;
    do {
      pfStack_7b0 = (fdb_kvs_handle *)0x10f593;
      sprintf(local_318,"k2ey%d",uVar5 & 0xffffffff);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(local_608 + 0x1f0,"m2eta%d",uVar5 & 0xffffffff);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(local_708,"b2ody%d",uVar5 & 0xffffffff);
      pfVar14 = (fdb_kvs_handle *)(&local_218[0].create_if_missing + (long)unaff_R12);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f5d6;
      unaff_R13._M_i = strlen(local_318);
      unaff_RBP = (fdb_kvs_handle *)(local_608 + 0x1f0);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config = (fdb_kvs_config *)strlen((char *)unaff_RBP);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f5f9;
      sVar3 = strlen(local_708);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar14,local_318,unaff_R13._M_i,unaff_RBP,(size_t)kvs_config,
                     local_708,sVar3);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)local_798._0_8_,
              *(fdb_doc **)(&local_218[0].create_if_missing + uVar5 * 8));
      uVar5 = uVar5 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar5 != 0x3c);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)local_788._16_8_,'\0');
    pfStack_7b0 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)local_798._0_8_,&local_748);
    if ((filemgr *)local_748.last_seqnum != (filemgr *)0x3c) {
      pfStack_7b0 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_7b0 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)local_798._0_8_);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)local_788._16_8_);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f68c;
    pfVar10 = (fdb_kvs_handle *)local_788._24_8_;
    fVar1 = fdb_compact((fdb_file_handle *)local_788._24_8_,(char *)0x0);
    ptr_handle = (fdb_kvs_handle **)0x3c;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config = (fdb_kvs_config *)(local_788 + 8);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)local_788._8_8_);
    pfVar14 = (fdb_kvs_handle *)(local_788 + 0x18);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)local_788._24_8_);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar14,"./compact_test1",(fdb_config *)(local_608 + 0xf8));
    pfStack_7b0 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)local_788._24_8_,(fdb_kvs_handle **)kvs_config,(char *)0x0,
                 &local_760);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f6ed;
    pfVar10 = (fdb_kvs_handle *)local_788._8_8_;
    fVar1 = fdb_set_log_callback
                      ((fdb_kvs_handle *)local_788._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ptr_handle = (fdb_kvs_handle **)0x0;
    kvs_config = (fdb_kvs_config *)(local_798 + 8);
    pfVar14 = (fdb_kvs_handle *)local_788;
    do {
      pfStack_7b0 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config,(void *)(*(size_t **)(local_608 + (long)ptr_handle))[4],
                     **(size_t **)(local_608 + (long)ptr_handle),(void *)0x0,0,(void *)0x0,0);
      pfStack_7b0 = (fdb_kvs_handle *)0x10f737;
      pfVar10 = (fdb_kvs_handle *)local_788._8_8_;
      fVar1 = fdb_get((fdb_kvs_handle *)local_788._8_8_,(fdb_doc *)local_798._8_8_);
      pfVar8 = (fdb_kvs_handle *)local_798._8_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_7b0 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      unaff_R13._M_i = (__int_type_conflict)(local_608 + (long)ptr_handle);
      unaff_R12 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)unaff_R13._M_i)->kvs_config;
      pfStack_7b0 = (fdb_kvs_handle *)0x10f765;
      iVar2 = bcmp(*(btree **)(local_798._8_8_ + 0x38),unaff_R12->staletree,
                   (size_t)((fdb_kvs_config *)local_798._8_8_)->custom_cmp);
      if (iVar2 != 0) {
        pfStack_7b0 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar8 = local_768;
        unaff_R12 = (fdb_kvs_handle *)local_788._0_8_;
      }
      pfStack_7b0 = (fdb_kvs_handle *)0x10f77b;
      iVar2 = bcmp((pfVar8->field_6).seqtree,(unaff_R12->field_6).seqtree,
                   (size_t)(pfVar8->kvs_config).custom_cmp_param);
      unaff_RBP = pfVar8;
      if (iVar2 != 0) {
        pfStack_7b0 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        unaff_RBP = (fdb_kvs_handle *)local_788._0_8_;
      }
      pfStack_7b0 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)unaff_RBP);
      ptr_handle = ptr_handle + 1;
    } while (ptr_handle != (fdb_kvs_handle **)0xf0);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(local_788 + 0x10),"./compact_test1.1",
             (fdb_config *)(local_608 + 0xf8));
    kvs_config = (fdb_kvs_config *)local_798;
    pfStack_7b0 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)local_788._16_8_,(fdb_kvs_handle **)kvs_config,(char *)0x0,
                 &local_760);
    pfStack_7b0 = (fdb_kvs_handle *)0x10f817;
    pfVar10 = (fdb_kvs_handle *)local_798._0_8_;
    fVar1 = fdb_set_log_callback
                      ((fdb_kvs_handle *)local_798._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_7b0 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)local_798._0_8_,&local_748);
      if ((filemgr *)local_748.last_seqnum != (filemgr *)0x3c) {
        pfStack_7b0 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      unaff_RBP = (fdb_kvs_handle *)0x0;
      ptr_handle = (fdb_kvs_handle **)(local_798 + 8);
      kvs_config = (fdb_kvs_config *)local_788;
      while( true ) {
        pfStack_7b0 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ptr_handle,
                       (void *)(*(size_t **)
                                 (&local_218[0].create_if_missing +
                                 (long)&(unaff_RBP->kvs_config).create_if_missing))[4],
                       **(size_t **)
                         (&local_218[0].create_if_missing +
                         (long)&(unaff_RBP->kvs_config).create_if_missing),(void *)0x0,0,(void *)0x0
                       ,0);
        pfStack_7b0 = (fdb_kvs_handle *)0x10f884;
        pfVar10 = (fdb_kvs_handle *)local_798._0_8_;
        fVar1 = fdb_get((fdb_kvs_handle *)local_798._0_8_,(fdb_doc *)local_798._8_8_);
        pfVar8 = (fdb_kvs_handle *)local_798._8_8_;
        if (fVar1 != FDB_RESULT_SUCCESS) break;
        unaff_R12 = (fdb_kvs_handle *)
                    (&local_218[0].create_if_missing +
                    (long)&(unaff_RBP->kvs_config).create_if_missing);
        pfVar14 = *(fdb_kvs_handle **)&unaff_R12->kvs_config;
        pfStack_7b0 = (fdb_kvs_handle *)0x10f8b1;
        iVar2 = bcmp(*(btree **)(local_798._8_8_ + 0x38),pfVar14->staletree,
                     (size_t)((fdb_kvs_config *)local_798._8_8_)->custom_cmp);
        if (iVar2 != 0) {
          pfStack_7b0 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar8 = local_768;
          pfVar14 = (fdb_kvs_handle *)local_788._0_8_;
        }
        pfStack_7b0 = (fdb_kvs_handle *)0x10f8c6;
        iVar2 = bcmp((pfVar8->field_6).seqtree,(pfVar14->field_6).seqtree,
                     (size_t)(pfVar8->kvs_config).custom_cmp_param);
        unaff_R13._M_i = (__int_type_conflict)pfVar8;
        if (iVar2 != 0) {
          pfStack_7b0 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          unaff_R13._M_i = local_788._0_8_;
        }
        pfStack_7b0 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)unaff_R13._M_i);
        unaff_RBP = (fdb_kvs_handle *)&(unaff_RBP->kvs_config).custom_cmp;
        if (unaff_RBP == (fdb_kvs_handle *)0x1e0) {
          lVar6 = 0;
          do {
            pfStack_7b0 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(local_608 + lVar6 * 8));
            pfStack_7b0 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&local_218[0].create_if_missing + lVar6 * 8));
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x1e);
          lVar6 = 0;
          do {
            pfStack_7b0 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(&local_218[10].create_if_missing + lVar6 * 8));
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x1e);
          pfStack_7b0 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)local_788._8_8_);
          pfStack_7b0 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)local_788._24_8_);
          pfStack_7b0 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)local_798._0_8_);
          pfStack_7b0 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)local_788._16_8_);
          pfStack_7b0 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_7b0 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar9 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar9 = "%s FAILED\n";
          }
          pfStack_7b0 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar9,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_7b0 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_7b0 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_7b0 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_7b0 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_7b0 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_7b0 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_7d8 = ptr_handle;
  pfStack_7d0 = unaff_R12;
  pfStack_7c8 = (fdb_kvs_handle *)unaff_R13._M_i;
  pfStack_7c0 = kvs_config;
  pfStack_7b8 = pfVar14;
  pfStack_7b0 = unaff_RBP;
  gettimeofday(&tStack_f08,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_ef8.buffercache_size = 0;
  fStack_ef8.wal_threshold = 0x400;
  fStack_ef8.compaction_threshold = '\0';
  if (pfVar10 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var11._M_i = (__int_type_conflict)&pfStack_f70;
    fVar1 = fdb_open((fdb_file_handle **)_Var11._M_i,"./compact_test1",&fStack_ef8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      _Var11._M_i = (__int_type_conflict)pfStack_f70;
      fVar1 = fdb_kvs_open_default((fdb_file_handle *)pfStack_f70,&pfStack_f68,&fStack_f50);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar6 = 0;
      uVar5 = 0;
      do {
        __s = &afStack_d00[0].config.encryption_key;
        sprintf((char *)__s,"key%d",uVar5 & 0xffffffff);
        sprintf((char *)afStack_d00,"meta%d",uVar5 & 0xffffffff);
        sprintf(acStack_e00,"body%d",uVar5 & 0xffffffff);
        unaff_R13._M_i = strlen((char *)__s);
        unaff_RBP = afStack_d00;
        sVar3 = strlen((char *)unaff_RBP);
        sVar4 = strlen(acStack_e00);
        fdb_doc_create((fdb_doc **)((long)&afStack_d00[0].bub_ctx.handle + lVar6),
                       &afStack_d00[0].config.encryption_key,unaff_R13._M_i,unaff_RBP,sVar3,
                       acStack_e00,sVar4);
        fdb_set(pfStack_f68,(fdb_doc *)(&afStack_d00[0].bub_ctx.handle)[uVar5]);
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 8;
      } while (uVar5 != 100);
      fdb_commit((fdb_file_handle *)pfStack_f70,'\0');
      fdb_get_kvs_info(pfStack_f68,&fStack_f38);
      if ((filemgr *)fStack_f38.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar6 = 0;
      pfVar14 = (fdb_kvs_handle *)&plStack_f60;
      do {
        fdb_del(pfStack_f68,(fdb_doc *)(&afStack_d00[0].bub_ctx.handle)[lVar6]);
        if (lVar6 == 0x32) {
          pthread_create((pthread_t *)pfVar14,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_f70);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 100);
      pthread_join((pthread_t)plStack_f60,&pvStack_f58);
      fdb_commit((fdb_file_handle *)pfStack_f70,'\x01');
      fdb_get_kvs_info(pfStack_f68,&fStack_f38);
      if ((filemgr *)fStack_f38.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_f68);
      _Var11._M_i = (__int_type_conflict)&pfStack_f70;
      fdb_close((fdb_file_handle *)pfStack_f70);
      fVar1 = fdb_open((fdb_file_handle **)_Var11._M_i,"./compact_test1",&fStack_ef8);
      unaff_R12 = (fdb_kvs_handle *)0x64;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var11._M_i = (__int_type_conflict)pfStack_f70;
      fVar1 = fdb_kvs_open_default((fdb_file_handle *)pfStack_f70,&pfStack_f68,&fStack_f50);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_f68,&fStack_f38);
        if ((filemgr *)fStack_f38.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar6 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_d00[0].bub_ctx.handle)[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 100);
        fdb_kvs_close(pfStack_f68);
        fdb_close((fdb_file_handle *)pfStack_f70);
        fdb_shutdown();
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar9,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var11._M_i = (__int_type_conflict)&pfStack_f70;
    fVar1 = fdb_open((fdb_file_handle **)_Var11._M_i,"./compact_test1",&fStack_ef8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var11._M_i = (__int_type_conflict)pfStack_f70;
    fVar1 = fdb_compact((fdb_file_handle *)pfStack_f70,(char *)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_f70);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle_00 = (filemgr *)0x0;
  pfStack_14d30 = (fdb_kvs_handle *)0x10fd83;
  auStack_14cf8._8_8_ = _Var11._M_i;
  gettimeofday(&tStack_14b90,(__timezone_ptr_t)0x0);
  pfStack_14d30 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_14d30 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar9 = auStack_14c98;
  pfStack_14d30 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_14d30 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_14c98._8_8_ = 0;
  aStack_14c88.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_14c74 = 1;
  uStack_14c6a = 0x1e01;
  pfStack_14c60 = (filemgr *)0x1;
  aStack_14c20.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ptr_fhandle = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x10fde7;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test",(fdb_config *)pcVar9);
  if (fVar1 != FDB_RESULT_INVALID_CONFIG) goto LAB_001108c3;
  aStack_14c20.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
  pfStack_14d30 = (fdb_kvs_handle *)0x10fe14;
  fdb_open((fdb_file_handle **)auStack_14d20,"compact_test",(fdb_config *)auStack_14c98);
  pcVar9 = auStack_14d18;
  pfStack_14d30 = (fdb_kvs_handle *)0x10fe29;
  fdb_kvs_open_default((fdb_file_handle *)auStack_14d20,(fdb_kvs_handle **)pcVar9,&fStack_14ce8);
  pfStack_14d30 = (fdb_kvs_handle *)0x10fe3f;
  ptr_fhandle = (char *)auStack_14d18;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
  pfStack_14d30 = (fdb_kvs_handle *)0x10fe53;
  puts("Initialize..");
  unaff_R13._M_i = 0;
  uVar5 = 0;
  do {
    pfStack_14d30 = (fdb_kvs_handle *)0x10fe75;
    sprintf(auStack_14b80 + 0x48,"key%04d",uVar5 & 0xffffffff);
    pfStack_14d30 = (fdb_kvs_handle *)0x10fe8e;
    sprintf(acStack_14938,"meta%04d",uVar5 & 0xffffffff);
    pfStack_14d30 = (fdb_kvs_handle *)0x10fea7;
    sprintf(acStack_14a38,"body%04d",uVar5 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(&afStack_14838[0].kvs_config.create_if_missing + unaff_R13._M_i);
    pfStack_14d30 = (fdb_kvs_handle *)0x10feba;
    sVar3 = strlen(auStack_14b80 + 0x48);
    unaff_RBP = (fdb_kvs_handle *)(sVar3 + 1);
    pfStack_14d30 = (fdb_kvs_handle *)0x10fece;
    sVar3 = strlen(acStack_14938);
    pfVar14 = (fdb_kvs_handle *)(sVar3 + 1);
    pfStack_14d30 = (fdb_kvs_handle *)0x10fedf;
    sVar3 = strlen(acStack_14a38);
    pfStack_14d30 = (fdb_kvs_handle *)0x10ff07;
    fdb_doc_create((fdb_doc **)unaff_R12,auStack_14b80 + 0x48,(size_t)unaff_RBP,acStack_14938,
                   (size_t)pfVar14,acStack_14a38,sVar3 + 1);
    pfStack_14d30 = (fdb_kvs_handle *)0x10ff19;
    fdb_set((fdb_kvs_handle *)auStack_14d18,
            *(fdb_doc **)(&afStack_14838[0].kvs_config.create_if_missing + uVar5 * 8));
    uVar5 = uVar5 + 1;
    unaff_R13._M_i = unaff_R13._M_i + 8;
  } while (uVar5 != 10000);
  pcVar9 = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x10ff3c;
  fdb_commit((fdb_file_handle *)auStack_14d20,'\0');
  pfStack_14d30 = (fdb_kvs_handle *)0x10ff44;
  fdb_close((fdb_file_handle *)auStack_14d20);
  pfStack_14d30 = (fdb_kvs_handle *)0x10ff5b;
  ptr_fhandle = pcVar9;
  fVar1 = fdb_open((fdb_file_handle **)pcVar9,"compact_test",(fdb_config *)auStack_14c98);
  ptr_fhandle_00 = (filemgr *)0x2710;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
  pfStack_14d30 = (fdb_kvs_handle *)0x10ff77;
  ptr_fhandle = (char *)auStack_14d20;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d20,(fdb_kvs_handle **)auStack_14d18,&fStack_14ce8
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
  pfStack_14d30 = (fdb_kvs_handle *)0x10ff97;
  ptr_fhandle = (char *)auStack_14d18;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
  pcVar9 = auStack_14b80;
  pfStack_14d30 = (fdb_kvs_handle *)0x10ffb4;
  fdb_get_file_info((fdb_file_handle *)auStack_14d20,(fdb_file_info *)pcVar9);
  pfStack_14d30 = (fdb_kvs_handle *)0x10ffc3;
  iVar2 = strcmp((char *)auStack_14b80._0_8_,"compact_test");
  if (iVar2 != 0) {
    pfStack_14d30 = (fdb_kvs_handle *)0x10ffd4;
    compaction_daemon_test();
  }
  ptr_fhandle_00 = (filemgr *)(auStack_14b80 + 0x48);
  pfVar14 = (fdb_kvs_handle *)auStack_14d08;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  _Var11._M_i = unaff_R13._M_i;
  do {
    pfStack_14d30 = (fdb_kvs_handle *)0x10fff8;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pfStack_14d30 = (fdb_kvs_handle *)0x110000;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pfStack_14d30 = (fdb_kvs_handle *)0x11001f;
    fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14d30 = (fdb_kvs_handle *)0x11002e;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14d18,(fdb_doc *)auStack_14d08._0_8_);
    unaff_R13._M_i = auStack_14d08._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
      pfStack_14d30 = (fdb_kvs_handle *)0x1108a3;
      compaction_daemon_test();
      goto LAB_001108a3;
    }
    unaff_RBP = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_14d08._0_8_ + 0x40))->
                seqtree;
    pcVar9 = *(char **)(*(long *)(&afStack_14838[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pfStack_14d30 = (fdb_kvs_handle *)0x11005a;
    iVar2 = bcmp(unaff_RBP,pcVar9,(size_t)*(void **)(auStack_14d08._0_8_ + 0x10));
    _Var11._M_i = unaff_R13._M_i;
    if (iVar2 != 0) {
      pfStack_14d30 = (fdb_kvs_handle *)0x11089e;
      compaction_daemon_test();
      goto LAB_0011089e;
    }
    pfStack_14d30 = (fdb_kvs_handle *)0x11006a;
    fdb_doc_free((fdb_doc *)unaff_R13._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pfStack_14d30 = (fdb_kvs_handle *)0x11008e;
  ptr_fhandle = (char *)auStack_14d18;
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)auStack_14d18,(fdb_kvs_handle **)&aStack_14cd0,10000);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
  pfStack_14d30 = (fdb_kvs_handle *)0x1100a0;
  fdb_kvs_close((fdb_kvs_handle *)aStack_14cd0.super___atomic_base<unsigned_long>._M_i);
  pcVar9 = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x1100ad;
  fdb_close((fdb_file_handle *)auStack_14d20);
  pfStack_14d30 = (fdb_kvs_handle *)0x1100b9;
  system("rm -rf  compact_test.meta > errorlog.txt");
  pfStack_14d30 = (fdb_kvs_handle *)0x1100d0;
  ptr_fhandle = pcVar9;
  fVar1 = fdb_open((fdb_file_handle **)pcVar9,"compact_test",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
  pfStack_14d30 = (fdb_kvs_handle *)0x1100ec;
  ptr_fhandle = (char *)auStack_14d20;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d20,(fdb_kvs_handle **)auStack_14d18,&fStack_14ce8
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
  pfStack_14d30 = (fdb_kvs_handle *)0x11010c;
  ptr_fhandle = (char *)auStack_14d18;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
  ptr_fhandle_00 = (filemgr *)(auStack_14b80 + 0x48);
  pfVar14 = (fdb_kvs_handle *)auStack_14d08;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_14d30 = (fdb_kvs_handle *)0x110138;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pfStack_14d30 = (fdb_kvs_handle *)0x110140;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pfStack_14d30 = (fdb_kvs_handle *)0x11015f;
    fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14d30 = (fdb_kvs_handle *)0x11016e;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14d18,(fdb_doc *)auStack_14d08._0_8_);
    _Var11._M_i = auStack_14d08._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
    unaff_RBP = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_14d08._0_8_ + 0x40))->
                seqtree;
    pcVar9 = *(char **)(*(long *)(&afStack_14838[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pfStack_14d30 = (fdb_kvs_handle *)0x11019a;
    iVar2 = bcmp(unaff_RBP,pcVar9,(size_t)*(void **)(auStack_14d08._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001108a3;
    pfStack_14d30 = (fdb_kvs_handle *)0x1101aa;
    fdb_doc_free((fdb_doc *)_Var11._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
    unaff_R13._M_i = _Var11._M_i;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pcVar9 = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x1101c7;
  fdb_close((fdb_file_handle *)auStack_14d20);
  pfStack_14d30 = (fdb_kvs_handle *)0x1101d3;
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  pfStack_14d30 = (fdb_kvs_handle *)0x1101ea;
  ptr_fhandle = pcVar9;
  fVar1 = fdb_open((fdb_file_handle **)pcVar9,"compact_test",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
  pfStack_14d30 = (fdb_kvs_handle *)0x110206;
  ptr_fhandle = (char *)auStack_14d20;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d20,(fdb_kvs_handle **)auStack_14d18,&fStack_14ce8
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
  pfStack_14d30 = (fdb_kvs_handle *)0x110226;
  ptr_fhandle = (char *)auStack_14d18;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
  ptr_fhandle_00 = (filemgr *)(auStack_14b80 + 0x48);
  pfVar14 = (fdb_kvs_handle *)auStack_14d08;
  unaff_R12 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_14d30 = (fdb_kvs_handle *)0x110252;
    sprintf((char *)ptr_fhandle_00,"key%04d",(ulong)unaff_R12 & 0xffffffff);
    pfStack_14d30 = (fdb_kvs_handle *)0x11025a;
    sVar3 = strlen((char *)ptr_fhandle_00);
    pfStack_14d30 = (fdb_kvs_handle *)0x110279;
    fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14d30 = (fdb_kvs_handle *)0x110288;
    ptr_fhandle = (char *)auStack_14d18;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_14d18,(fdb_doc *)auStack_14d08._0_8_);
    _Var11._M_i = auStack_14d08._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108be;
    unaff_RBP = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_14d08._0_8_ + 0x40))->
                seqtree;
    pcVar9 = *(char **)(*(long *)(&afStack_14838[0].kvs_config.create_if_missing +
                                 (long)unaff_R12 * 8) + 0x40);
    pfStack_14d30 = (fdb_kvs_handle *)0x1102b4;
    iVar2 = bcmp(unaff_RBP,pcVar9,(size_t)*(void **)(auStack_14d08._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001108b3;
    pfStack_14d30 = (fdb_kvs_handle *)0x1102c4;
    fdb_doc_free((fdb_doc *)_Var11._M_i);
    unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
    unaff_R13._M_i = _Var11._M_i;
  } while (unaff_R12 != (fdb_kvs_handle *)0x2710);
  pfStack_14d30 = (fdb_kvs_handle *)0x1102de;
  fdb_close((fdb_file_handle *)auStack_14d20);
  ptr_fhandle = auStack_14cf8;
  pfStack_14d30 = (fdb_kvs_handle *)0x1102f7;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_less",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
  pfStack_14d30 = (fdb_kvs_handle *)0x110313;
  ptr_fhandle = (char *)auStack_14cf8._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14cf8._0_8_,(fdb_kvs_handle **)&aStack_14cb8.seqtree
                     ,&fStack_14ce8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110904;
  uStack_14c6a = uStack_14c6a & 0xff;
  ptr_fhandle = auStack_14d08 + 8;
  pfStack_14d30 = (fdb_kvs_handle *)0x110338;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110909;
  pfStack_14d30 = (fdb_kvs_handle *)0x110354;
  ptr_fhandle = (char *)auStack_14d08._8_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d08._8_8_,(fdb_kvs_handle **)&_Stack_14cc0,
                     &fStack_14ce8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
  uStack_14c6a = uStack_14c6a & 0xff00;
  ptr_fhandle = auStack_14d10;
  pfStack_14d30 = (fdb_kvs_handle *)0x110379;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual",(fdb_config *)auStack_14c98
                  );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110913;
  pfStack_14d30 = (fdb_kvs_handle *)0x110395;
  ptr_fhandle = (char *)auStack_14d10;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d10,(fdb_kvs_handle **)&aStack_14cc8.seqtree,
                     &fStack_14ce8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110918;
  uStack_14c6a = 0x1e01;
  ptr_fhandle = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x1103bc;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
  pfStack_14d30 = (fdb_kvs_handle *)0x1103d8;
  ptr_fhandle = (char *)auStack_14d20;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d20,(fdb_kvs_handle **)auStack_14d18,&fStack_14ce8
                    );
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110922;
  pfStack_14d30 = (fdb_kvs_handle *)0x1103f8;
  ptr_fhandle = (char *)auStack_14d18;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18,logCallbackFunc,"compaction_daemon_test");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110927;
  _Var11._M_i = 0;
  pfStack_14d30 = (fdb_kvs_handle *)0x110416;
  printf("wait for %d seconds..\n");
  pcVar9 = auStack_14ba0;
  pfStack_14d30 = (fdb_kvs_handle *)0x110428;
  gettimeofday((timeval *)pcVar9,(__timezone_ptr_t)0x0);
  tVar16.tv_usec = auStack_14ba0._8_8_;
  tVar16.tv_sec = auStack_14ba0._0_8_;
  unaff_R12 = (fdb_kvs_handle *)auStack_14ca8;
  while( true ) {
    pfStack_14d30 = (fdb_kvs_handle *)0x110449;
    fdb_set((fdb_kvs_handle *)auStack_14d18,
            *(fdb_doc **)(&afStack_14838[0].kvs_config.create_if_missing + _Var11._M_i * 8));
    pfStack_14d30 = (fdb_kvs_handle *)0x110455;
    fdb_commit((fdb_file_handle *)auStack_14d20,'\0');
    if ((ushort)((ushort)((short)_Var11._M_i * 0x5c29) >> 2 | (short)_Var11._M_i * 0x4000) < 0x290)
    {
      pfStack_14d30 = (fdb_kvs_handle *)0x11047c;
      fdb_set((fdb_kvs_handle *)aStack_14cb8.seqtree,
              *(fdb_doc **)(&afStack_14838[0].kvs_config.create_if_missing + _Var11._M_i * 8));
      pfStack_14d30 = (fdb_kvs_handle *)0x110488;
      fdb_commit((fdb_file_handle *)auStack_14cf8._0_8_,'\0');
    }
    pfStack_14d30 = (fdb_kvs_handle *)0x11049a;
    fdb_set((fdb_kvs_handle *)_Stack_14cc0._M_i,
            *(fdb_doc **)(&afStack_14838[0].kvs_config.create_if_missing + _Var11._M_i * 8));
    pfStack_14d30 = (fdb_kvs_handle *)0x1104a6;
    fdb_commit((fdb_file_handle *)auStack_14d08._8_8_,'\0');
    pfStack_14d30 = (fdb_kvs_handle *)0x1104b8;
    fdb_set((fdb_kvs_handle *)aStack_14cc8.seqtree,
            *(fdb_doc **)(&afStack_14838[0].kvs_config.create_if_missing + _Var11._M_i * 8));
    pfStack_14d30 = (fdb_kvs_handle *)0x1104c4;
    fdb_commit((fdb_file_handle *)auStack_14d10,'\0');
    pfStack_14d30 = (fdb_kvs_handle *)0x1104ce;
    gettimeofday((timeval *)unaff_R12,(__timezone_ptr_t)0x0);
    pfStack_14d30 = (fdb_kvs_handle *)0x1104e9;
    tVar15 = _utime_gap(tVar16,(timeval)auStack_14ca8);
    if ((ulong)auStack_14cf8._8_8_ <= (fdb_kvs_handle *)tVar15.tv_sec) break;
    _Var11._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var11._M_i)->kvs_config).field_0x1;
    if ((undefined1 *)_Var11._M_i == (undefined1 *)0x2710) {
      _Var11._M_i = 0;
    }
  }
  pfStack_14d30 = (fdb_kvs_handle *)0x110517;
  ptr_fhandle = (char *)auStack_14d20;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_14d20,0x3c);
  ptr_fhandle_00 = (filemgr *)auStack_14ba0._0_8_;
  pfVar14 = (fdb_kvs_handle *)auStack_14ba0._8_8_;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
  pfStack_14d30 = (fdb_kvs_handle *)0x11052e;
  ptr_fhandle = (char *)auStack_14d20;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_14d20,1);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110931;
  pfStack_14d30 = (fdb_kvs_handle *)0x110542;
  ptr_fhandle = (char *)auStack_14d08._8_8_;
  fVar1 = fdb_compact((fdb_file_handle *)auStack_14d08._8_8_,(char *)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110936;
  pfStack_14d30 = (fdb_kvs_handle *)0x11055b;
  ptr_fhandle = (char *)auStack_14d10;
  fVar1 = fdb_compact((fdb_file_handle *)auStack_14d10,"compact_test_manual_compacted");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
  uStack_14c6a = uStack_14c6a & 0xff00;
  ptr_fhandle = auStack_14cb0;
  pfStack_14d30 = (fdb_kvs_handle *)0x110580;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110940;
  pfStack_14d30 = (fdb_kvs_handle *)0x11059c;
  ptr_fhandle = (char *)auStack_14d10;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_14d10,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
  pfStack_14d30 = (fdb_kvs_handle *)0x1105af;
  fVar1 = fdb_close((fdb_file_handle *)auStack_14cb0);
  ptr_fhandle = (char *)auStack_14cb0;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
  pfStack_14d30 = (fdb_kvs_handle *)0x1105cb;
  ptr_fhandle = (char *)auStack_14d10;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_14d10,'\x01',10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
  pfStack_14d30 = (fdb_kvs_handle *)0x1105e7;
  ptr_fhandle = (char *)auStack_14d10;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_14d10,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110954;
  pfStack_14d30 = (fdb_kvs_handle *)0x1105f9;
  ptr_fhandle = (char *)auStack_14d10;
  fVar1 = fdb_close((fdb_file_handle *)auStack_14d10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110959;
  uStack_14c6a = CONCAT11(uStack_14c6a._1_1_,1);
  ptr_fhandle = auStack_14d10;
  pfStack_14d30 = (fdb_kvs_handle *)0x11061e;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
  pfStack_14d30 = (fdb_kvs_handle *)0x110634;
  ptr_fhandle = (char *)auStack_14d08._8_8_;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_14d08._8_8_,'\0',0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110963;
  pfStack_14d30 = (fdb_kvs_handle *)0x110646;
  ptr_fhandle = (char *)auStack_14d08._8_8_;
  fVar1 = fdb_close((fdb_file_handle *)auStack_14d08._8_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110968;
  uStack_14c6a = uStack_14c6a & 0xff00;
  ptr_fhandle = auStack_14d08 + 8;
  pfStack_14d30 = (fdb_kvs_handle *)0x11066b;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
  pcVar9 = "compact_test_non.manual";
  pfStack_14d30 = (fdb_kvs_handle *)0x110687;
  fdb_compact((fdb_file_handle *)auStack_14d08._8_8_,"compact_test_non.manual");
  ptr_fhandle_00 = (filemgr *)auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x110694;
  fdb_close((fdb_file_handle *)auStack_14d20);
  pfStack_14d30 = (fdb_kvs_handle *)0x11069e;
  fdb_close((fdb_file_handle *)auStack_14cf8._0_8_);
  pfStack_14d30 = (fdb_kvs_handle *)0x1106a8;
  fdb_close((fdb_file_handle *)auStack_14d10);
  uStack_14c6a = CONCAT11(uStack_14c6a._1_1_,1);
  pfStack_14d30 = (fdb_kvs_handle *)0x1106bf;
  ptr_fhandle = (char *)ptr_fhandle_00;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle_00,"compact_test_non.manual",
                   (fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
  ptr_fhandle = "compact_test_non.manual";
  pfStack_14d30 = (fdb_kvs_handle *)0x1106dc;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
  uStack_14c6a = uStack_14c6a & 0xff00;
  ptr_fhandle = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x110702;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_manual_compacted",
                   (fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
  ptr_fhandle = "compact_test_manual_compacted";
  pfStack_14d30 = (fdb_kvs_handle *)0x11071f;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
  uStack_14c6a = CONCAT11(uStack_14c6a._1_1_,1);
  ptr_fhandle = "compact_test_manual_compacted";
  pfStack_14d30 = (fdb_kvs_handle *)0x110740;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110986;
  uStack_14c6a = uStack_14c6a & 0xff00;
  ptr_fhandle = "compact_test_non.manual";
  pfStack_14d30 = (fdb_kvs_handle *)0x110760;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
  pfStack_14d30 = (fdb_kvs_handle *)0x110773;
  fdb_close((fdb_file_handle *)auStack_14d08._8_8_);
  pfStack_14d30 = (fdb_kvs_handle *)0x110778;
  fVar1 = fdb_shutdown();
  ptr_fhandle = (char *)auStack_14d08._8_8_;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110990;
  ptr_fhandle = "compact_test_non.manual";
  pfStack_14d30 = (fdb_kvs_handle *)0x110794;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110995;
  fStack_14c74 = 2;
  ptr_fhandle = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x1107bc;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test_manual_compacted",
                   (fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
  ptr_fhandle = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x1107de;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test_manual_compacted.meta",
                   (fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
  ptr_fhandle = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x110800;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non",(fdb_config *)auStack_14c98);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
  ptr_fhandle = auStack_14d20;
  pfStack_14d30 = (fdb_kvs_handle *)0x110822;
  fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                   (fdb_config *)auStack_14c98);
  if (fVar1 == FDB_RESULT_NO_SUCH_FILE) {
    lVar6 = 0;
    do {
      pfStack_14d30 = (fdb_kvs_handle *)0x11083a;
      fdb_doc_free(*(fdb_doc **)(&afStack_14838[0].kvs_config.create_if_missing + lVar6 * 8));
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10000);
    pfStack_14d30 = (fdb_kvs_handle *)0x11084b;
    fdb_shutdown();
    pfStack_14d30 = (fdb_kvs_handle *)0x110850;
    memleak_end();
    pcVar9 = "%s PASSED\n";
    if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
      pcVar9 = "%s FAILED\n";
    }
    pfStack_14d30 = (fdb_kvs_handle *)0x110881;
    fprintf(_stderr,pcVar9,"compaction daemon test");
    return;
  }
  goto LAB_001109a9;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_001108a3:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  unaff_R13._M_i = _Var11._M_i;
LAB_001108ae:
  _Var11._M_i = unaff_R13._M_i;
  pfStack_14d30 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108be;
  ptr_fhandle = pcVar9;
  compaction_daemon_test();
  unaff_R13._M_i = _Var11._M_i;
LAB_001108be:
  pfVar14 = (fdb_kvs_handle *)auStack_14d08;
  ptr_fhandle_00 = (filemgr *)(auStack_14b80 + 0x48);
  pfStack_14d30 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
LAB_001108c3:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108c8;
  compaction_daemon_test();
LAB_001108c8:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108cd;
  compaction_daemon_test();
LAB_001108cd:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108d2;
  compaction_daemon_test();
LAB_001108d2:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108d7;
  compaction_daemon_test();
LAB_001108d7:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108dc;
  compaction_daemon_test();
LAB_001108dc:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108e1;
  compaction_daemon_test();
LAB_001108e1:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108e6;
  compaction_daemon_test();
LAB_001108e6:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108eb;
  compaction_daemon_test();
  _Var11._M_i = unaff_R13._M_i;
LAB_001108eb:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108f0;
  compaction_daemon_test();
LAB_001108f0:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108f5;
  compaction_daemon_test();
LAB_001108f5:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108fa;
  compaction_daemon_test();
LAB_001108fa:
  pfStack_14d30 = (fdb_kvs_handle *)0x1108ff;
  compaction_daemon_test();
LAB_001108ff:
  pfStack_14d30 = (fdb_kvs_handle *)0x110904;
  compaction_daemon_test();
LAB_00110904:
  pfStack_14d30 = (fdb_kvs_handle *)0x110909;
  compaction_daemon_test();
LAB_00110909:
  pfStack_14d30 = (fdb_kvs_handle *)0x11090e;
  compaction_daemon_test();
LAB_0011090e:
  pfStack_14d30 = (fdb_kvs_handle *)0x110913;
  compaction_daemon_test();
LAB_00110913:
  pfStack_14d30 = (fdb_kvs_handle *)0x110918;
  compaction_daemon_test();
LAB_00110918:
  pfStack_14d30 = (fdb_kvs_handle *)0x11091d;
  compaction_daemon_test();
LAB_0011091d:
  pfStack_14d30 = (fdb_kvs_handle *)0x110922;
  compaction_daemon_test();
LAB_00110922:
  pfStack_14d30 = (fdb_kvs_handle *)0x110927;
  compaction_daemon_test();
LAB_00110927:
  pfStack_14d30 = (fdb_kvs_handle *)0x11092c;
  compaction_daemon_test();
LAB_0011092c:
  pfStack_14d30 = (fdb_kvs_handle *)0x110931;
  compaction_daemon_test();
LAB_00110931:
  pfStack_14d30 = (fdb_kvs_handle *)0x110936;
  compaction_daemon_test();
LAB_00110936:
  pfStack_14d30 = (fdb_kvs_handle *)0x11093b;
  compaction_daemon_test();
LAB_0011093b:
  pfStack_14d30 = (fdb_kvs_handle *)0x110940;
  compaction_daemon_test();
LAB_00110940:
  pfStack_14d30 = (fdb_kvs_handle *)0x110945;
  compaction_daemon_test();
LAB_00110945:
  pfStack_14d30 = (fdb_kvs_handle *)0x11094a;
  compaction_daemon_test();
LAB_0011094a:
  pfStack_14d30 = (fdb_kvs_handle *)0x11094f;
  compaction_daemon_test();
LAB_0011094f:
  pfStack_14d30 = (fdb_kvs_handle *)0x110954;
  compaction_daemon_test();
LAB_00110954:
  pfStack_14d30 = (fdb_kvs_handle *)0x110959;
  compaction_daemon_test();
LAB_00110959:
  pfStack_14d30 = (fdb_kvs_handle *)0x11095e;
  compaction_daemon_test();
LAB_0011095e:
  pfStack_14d30 = (fdb_kvs_handle *)0x110963;
  compaction_daemon_test();
LAB_00110963:
  pfStack_14d30 = (fdb_kvs_handle *)0x110968;
  compaction_daemon_test();
LAB_00110968:
  pfStack_14d30 = (fdb_kvs_handle *)0x11096d;
  compaction_daemon_test();
LAB_0011096d:
  pfStack_14d30 = (fdb_kvs_handle *)0x110972;
  compaction_daemon_test();
LAB_00110972:
  pfStack_14d30 = (fdb_kvs_handle *)0x110977;
  compaction_daemon_test();
LAB_00110977:
  pfStack_14d30 = (fdb_kvs_handle *)0x11097c;
  compaction_daemon_test();
LAB_0011097c:
  pfStack_14d30 = (fdb_kvs_handle *)0x110981;
  compaction_daemon_test();
LAB_00110981:
  pfStack_14d30 = (fdb_kvs_handle *)0x110986;
  compaction_daemon_test();
LAB_00110986:
  pfStack_14d30 = (fdb_kvs_handle *)0x11098b;
  compaction_daemon_test();
LAB_0011098b:
  pfStack_14d30 = (fdb_kvs_handle *)0x110990;
  compaction_daemon_test();
LAB_00110990:
  pfStack_14d30 = (fdb_kvs_handle *)0x110995;
  compaction_daemon_test();
LAB_00110995:
  pfStack_14d30 = (fdb_kvs_handle *)0x11099a;
  compaction_daemon_test();
LAB_0011099a:
  pfStack_14d30 = (fdb_kvs_handle *)0x11099f;
  compaction_daemon_test();
LAB_0011099f:
  pfStack_14d30 = (fdb_kvs_handle *)0x1109a4;
  compaction_daemon_test();
LAB_001109a4:
  pfStack_14d30 = (fdb_kvs_handle *)0x1109a9;
  compaction_daemon_test();
LAB_001109a9:
  pfStack_14d30 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_14ec8 = (fdb_kvs_handle *)0x1109ce;
  pfStack_14d58 = (filemgr *)pcVar9;
  pfStack_14d50 = unaff_R12;
  pfStack_14d48 = (fdb_kvs_handle *)_Var11._M_i;
  pfStack_14d40 = ptr_fhandle_00;
  pfStack_14d38 = pfVar14;
  pfStack_14d30 = unaff_RBP;
  gettimeofday(&tStack_14e78,(__timezone_ptr_t)0x0);
  pfStack_14ec8 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_14ec8 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_14ec8 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_14e22 = 1;
  uStack_14e18._0_2_ = 1;
  uStack_14e18._2_2_ = 0;
  uStack_14e18._4_4_ = 0;
  pfStack_14ec8 = (fdb_kvs_handle *)0x110a0d;
  fVar1 = fdb_open(&pfStack_14eb8,"compact_test",(fdb_config *)(auStack_14e68 + 0x18));
  pfVar12 = (fdb_config *)(auStack_14e68 + 0x18);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar12 = (fdb_config *)auStack_14e68;
    pfStack_14ec8 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_14ec8 = (fdb_kvs_handle *)0x110a34;
    fVar1 = fdb_kvs_open_default(pfStack_14eb8,&pfStack_14eb0,(fdb_kvs_config *)pfVar12);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_14ec8 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_14e88,(__timezone_ptr_t)0x0);
    pfStack_14ec8 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)ptr_fhandle & 0xffffffff);
    tVar15.tv_usec = tStack_14e88.tv_usec;
    tVar15.tv_sec = tStack_14e88.tv_sec;
    _Var11._M_i = (long)&atStack_14ea8[1].tv_sec + 1;
    unaff_RBP = (fdb_kvs_handle *)0x0;
    do {
      iVar2 = (int)unaff_RBP;
      pfStack_14ec8 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var11._M_i,"%d",unaff_RBP);
      unaff_R12 = pfStack_14eb0;
      pfStack_14ec8 = (fdb_kvs_handle *)0x110a89;
      sVar3 = strlen((char *)_Var11._M_i);
      pfStack_14ec8 = (fdb_kvs_handle *)0x110aa4;
      fVar1 = fdb_set_kv(unaff_R12,(void *)_Var11._M_i,sVar3,"value",5);
      pfVar12 = (fdb_config *)tStack_14e88.tv_sec;
      pfVar14 = (fdb_kvs_handle *)tStack_14e88.tv_usec;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_14ec8 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_14ec8 = (fdb_kvs_handle *)0x110ab8;
      fVar1 = fdb_commit(pfStack_14eb8,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_14ec8 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_14ec8 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_14ea8,(__timezone_ptr_t)0x0);
      pfStack_14ec8 = (fdb_kvs_handle *)0x110ae1;
      tVar16 = _utime_gap(tVar15,atStack_14ea8[0]);
    } while (((filemgr *)tVar16.tv_sec < ptr_fhandle) &&
            (unaff_RBP = (fdb_kvs_handle *)(ulong)(iVar2 + 1), iVar2 != 99999));
    pfStack_14ec8 = (fdb_kvs_handle *)0x110b01;
    fVar1 = fdb_close(pfStack_14eb8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_14ec8 = (fdb_kvs_handle *)0x110b0a;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_14ec8 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pfStack_14ec8 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar9,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_14ec8 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_14ec8 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_14ec8 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_14ec8 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_14ef0 = (filemgr *)ptr_fhandle;
  pfStack_14ee8 = unaff_R12;
  pfStack_14ee0 = (fdb_kvs_handle *)_Var11._M_i;
  pfStack_14ed8 = pfVar12;
  pfStack_14ed0 = pfVar14;
  pfStack_14ec8 = unaff_RBP;
  gettimeofday(&tStack_151f8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_15268._32_8_ = (btree *)0x0;
  auStack_15268._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_14fe8.wal_threshold = 0x1000;
  fStack_14fe8.compaction_mode = '\x01';
  fStack_14fe8.compaction_threshold = '\n';
  fStack_14fe8.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14d0c5;
  pfVar14 = (fdb_kvs_handle *)&pfStack_15288;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)pfVar14,"compact_test",&fStack_14fe8,1,
                              (char **)(auStack_15268 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_15268 + 0x18),(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_15268._16_8_ = afStack_151e8[0].doc_count;
    auStack_15268._0_8_ = afStack_151e8[0].filename;
    auStack_15268._8_8_ = afStack_151e8[0].new_filename;
    info = (fdb_file_info *)auStack_15280;
    pfVar14 = pfStack_15288;
    fVar1 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_15288,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_15268);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info = (fdb_file_info *)auStack_15270;
    kvs_config_00 = (fdb_file_info *)auStack_15268;
    pfVar14 = pfStack_15288;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_15288,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar5 = 0;
    do {
      sprintf((char *)afStack_151e8,"key%06d",uVar5);
      sprintf((char *)afStack_150e8,"body%06d",uVar5);
      pfVar14 = (fdb_kvs_handle *)auStack_15280._0_8_;
      sVar3 = strlen((char *)afStack_151e8);
      sVar4 = strlen((char *)afStack_150e8);
      kvs_config_00 = afStack_150e8;
      info = afStack_151e8;
      fVar1 = fdb_set_kv(pfVar14,afStack_151e8,sVar3,afStack_150e8,sVar4);
      handle = auStack_15270;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar3 = strlen((char *)afStack_151e8);
      sVar4 = strlen((char *)afStack_150e8);
      kvs_config_00 = afStack_150e8;
      info = afStack_151e8;
      fVar1 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_151e8,sVar3,afStack_150e8,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar14 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar7 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar7;
    } while (uVar7 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_15268;
    auStack_15268._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_15280 + 8);
    pfVar14 = pfStack_15288;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_15288,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info = afStack_151e8;
    sprintf((char *)info,"key%06d",0);
    kvs_config_00 = afStack_150e8;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar3 = strlen((char *)info);
    sVar4 = strlen((char *)kvs_config_00);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)auStack_15280._8_8_,info,sVar3,kvs_config_00,sVar4);
    pfVar14 = (fdb_kvs_handle *)auStack_15280._8_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info = (fdb_file_info *)0x0;
    pfVar14 = pfStack_15288;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_15288,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar5 = 0;
    uVar13 = 0;
    do {
      sprintf((char *)afStack_151e8,"key%06d",uVar13);
      sprintf((char *)afStack_150e8,"body%06d",uVar13);
      pfVar14 = (fdb_kvs_handle *)auStack_15280._0_8_;
      sVar3 = strlen((char *)afStack_151e8);
      sVar4 = strlen((char *)afStack_150e8);
      kvs_config_00 = afStack_150e8;
      info = afStack_151e8;
      fVar1 = fdb_set_kv(pfVar14,afStack_151e8,sVar3,afStack_150e8,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info = (fdb_file_info *)(auStack_15268 + 0x28);
      pfVar14 = pfStack_15288;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_15288,info);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar5 < uStack_15218) {
        uVar5 = uStack_15218;
      }
      uVar7 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar7;
    } while (uVar7 != 10000);
    info = (fdb_file_info *)0x0;
    pfVar14 = pfStack_15288;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_15288,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info = (fdb_file_info *)(auStack_15268 + 0x28);
    pfVar14 = pfStack_15288;
    fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_15288,info);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar5 < uStack_15218) {
      uVar5 = uStack_15218;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar5);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_15268 + 0x28);
      pfVar14 = pfStack_15288;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_15288,
                                (fdb_file_info *)(auStack_15268 + 0x28));
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar5 <= uStack_15218);
    fVar1 = fdb_close((fdb_file_handle *)pfStack_15288);
    pfVar14 = pfStack_15288;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      pfVar14 = pfStack_15288;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar9,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info == kvs_config_00) {
    memcmp(pfVar14,__s2,(size_t)info);
    return;
  }
  if (info < kvs_config_00) {
    kvs_config_00 = info;
  }
  memcmp(pfVar14,__s2,(size_t)kvs_config_00);
  return;
}

Assistant:

void db_compact_overwrite()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile2;
    fdb_kvs_handle *db, *db2;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc **doc2 = alca(fdb_doc *, 2*n);
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_info kvs_info;
    fdb_kvs_config kvs_config;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // write to db1
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Open the empty db with future compact name
    fdb_open(&dbfile2, "./compact_test1.1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // write to db2
    for (i=0;i < 2*n;++i){
        sprintf(keybuf, "k2ey%d", i);
        sprintf(metabuf, "m2eta%d", i);
        sprintf(bodybuf, "b2ody%d", i);
        fdb_doc_create(&doc2[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db2, doc2[i]);
    }
    fdb_commit(dbfile2, FDB_COMMIT_NORMAL);


    // verify db2 seqnum and close
    fdb_get_kvs_info(db2, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == (uint64_t)2*n);
    fdb_kvs_close(db2);
    fdb_close(dbfile2);

    // compact db1
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db1
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen db1
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // read db1
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        // free result document
        fdb_doc_free(rdoc);
    }

    // reopen db2
    fdb_open(&dbfile2, "./compact_test1.1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(db2, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == (uint64_t)2*n);

    // read db2
    for (i=0;i<2*n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc2[i]->key, doc2[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen));
        // free result document
        fdb_doc_free(rdoc);
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
        fdb_doc_free(doc2[i]);
    }
    for (i=n;i<2*n;++i){
        fdb_doc_free(doc2[i]);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_kvs_close(db2);
    fdb_close(dbfile2);


    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact overwrite");
}